

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_frozen_view(char *buf,size_t length)

{
  char cVar1;
  uint *puVar2;
  void *pvVar3;
  uint *puVar4;
  int *piVar5;
  array_container_t *array;
  run_container_t *run;
  bitset_container_t *bitset;
  int32_t i_1;
  roaring_bitmap_t *rb;
  char *arena;
  size_t alloc_size;
  uint16_t *array_zone;
  rle16_t *run_zone;
  uint64_t *bitset_zone;
  long lStack_68;
  int32_t i;
  size_t array_zone_size;
  size_t run_zone_size;
  size_t bitset_zone_size;
  int local_48;
  int32_t num_array_containers;
  int32_t num_run_containers;
  int32_t num_bitset_containers;
  uint8_t *typecodes;
  uint16_t *counts;
  uint16_t *keys;
  int32_t num_containers;
  uint32_t header;
  size_t length_local;
  char *buf_local;
  
  if (((ulong)buf & 0x1f) == 0) {
    if (length < 4) {
      buf_local = (char *)0x0;
    }
    else {
      keys._4_4_ = *(uint *)(buf + (length - 4));
      if ((keys._4_4_ & 0x7fff) == 0x35c6) {
        keys._0_4_ = keys._4_4_ >> 0xf;
        if (length < (long)(int)(uint)keys * 5 + 4U) {
          buf_local = (char *)0x0;
        }
        else {
          counts = (uint16_t *)(buf + ((length - 4) - (long)(int)((uint)keys * 5)));
          typecodes = (uint8_t *)(buf + ((length - 4) - (long)(int)((uint)keys * 3)));
          _num_run_containers = buf + ((length - 4) - (long)(int)(uint)keys);
          num_array_containers = 0;
          local_48 = 0;
          bitset_zone_size._4_4_ = 0;
          run_zone_size = 0;
          array_zone_size = 0;
          lStack_68 = 0;
          for (bitset_zone._4_4_ = 0; bitset_zone._4_4_ < (int)(uint)keys;
              bitset_zone._4_4_ = bitset_zone._4_4_ + 1) {
            cVar1 = _num_run_containers[bitset_zone._4_4_];
            if (cVar1 == '\x01') {
              num_array_containers = num_array_containers + 1;
              run_zone_size = run_zone_size + 0x2000;
            }
            else if (cVar1 == '\x02') {
              bitset_zone_size._4_4_ = bitset_zone_size._4_4_ + 1;
              lStack_68 = (ulong)(*(ushort *)(typecodes + (long)bitset_zone._4_4_ * 2) + 1) * 2 +
                          lStack_68;
            }
            else {
              if (cVar1 != '\x03') {
                return (roaring_bitmap_t *)0x0;
              }
              local_48 = local_48 + 1;
              array_zone_size =
                   (ulong)*(ushort *)(typecodes + (long)bitset_zone._4_4_ * 2) * 4 + array_zone_size
              ;
            }
          }
          if (length == run_zone_size + array_zone_size + lStack_68 + (long)(int)((uint)keys * 5) +
                        4) {
            array_zone = (uint16_t *)(buf + run_zone_size);
            alloc_size = (size_t)(buf + array_zone_size + run_zone_size);
            arena = (char *)((long)bitset_zone_size._4_4_ * 0x10 +
                            (long)local_48 * 0x10 +
                            (long)num_array_containers * 0x10 + (long)(int)(uint)keys * 8 + 0x28);
            run_zone = (rle16_t *)buf;
            _num_containers = length;
            length_local = (size_t)buf;
            rb = (roaring_bitmap_t *)malloc((size_t)arena);
            if (rb == (roaring_bitmap_t *)0x0) {
              buf_local = (char *)0x0;
            }
            else {
              puVar2 = (uint *)arena_alloc((char **)&rb,0x28);
              *(undefined1 *)(puVar2 + 8) = 2;
              puVar2[1] = (uint)keys;
              *puVar2 = (uint)keys;
              *(uint16_t **)(puVar2 + 4) = counts;
              *(char **)(puVar2 + 6) = _num_run_containers;
              pvVar3 = arena_alloc((char **)&rb,(long)(int)(uint)keys << 3);
              *(void **)(puVar2 + 2) = pvVar3;
              for (bitset._4_4_ = 0; buf_local = (char *)puVar2, bitset._4_4_ < (int)(uint)keys;
                  bitset._4_4_ = bitset._4_4_ + 1) {
                cVar1 = _num_run_containers[bitset._4_4_];
                if (cVar1 == '\x01') {
                  piVar5 = (int *)arena_alloc((char **)&rb,0x10);
                  *(rle16_t **)(piVar5 + 2) = run_zone;
                  *piVar5 = *(ushort *)(typecodes + (long)bitset._4_4_ * 2) + 1;
                  *(int **)(*(long *)(puVar2 + 2) + (long)bitset._4_4_ * 8) = piVar5;
                  run_zone = run_zone + 0x800;
                }
                else if (cVar1 == '\x02') {
                  piVar5 = (int *)arena_alloc((char **)&rb,0x10);
                  piVar5[1] = *(ushort *)(typecodes + (long)bitset._4_4_ * 2) + 1;
                  *piVar5 = *(ushort *)(typecodes + (long)bitset._4_4_ * 2) + 1;
                  *(size_t *)(piVar5 + 2) = alloc_size;
                  *(int **)(*(long *)(puVar2 + 2) + (long)bitset._4_4_ * 8) = piVar5;
                  alloc_size = alloc_size +
                               (ulong)(*(ushort *)(typecodes + (long)bitset._4_4_ * 2) + 1) * 2;
                }
                else {
                  if (cVar1 != '\x03') {
                    free(rb);
                    return (roaring_bitmap_t *)0x0;
                  }
                  puVar4 = (uint *)arena_alloc((char **)&rb,0x10);
                  puVar4[1] = (uint)*(ushort *)(typecodes + (long)bitset._4_4_ * 2);
                  *puVar4 = (uint)*(ushort *)(typecodes + (long)bitset._4_4_ * 2);
                  *(uint16_t **)(puVar4 + 2) = array_zone;
                  *(uint **)(*(long *)(puVar2 + 2) + (long)bitset._4_4_ * 8) = puVar4;
                  array_zone = array_zone + (long)(int)*puVar4 * 2;
                }
              }
            }
          }
          else {
            buf_local = (char *)0x0;
          }
        }
      }
      else {
        buf_local = (char *)0x0;
      }
    }
  }
  else {
    buf_local = (char *)0x0;
  }
  return (roaring_bitmap_t *)buf_local;
}

Assistant:

const roaring_bitmap_t *
roaring_bitmap_frozen_view(const char *buf, size_t length) {
    if ((uintptr_t)buf % 32 != 0) {
        return NULL;
    }

    // cookie and num_containers
    if (length < 4) {
        return NULL;
    }
    uint32_t header;
    memcpy(&header, buf + length - 4, 4); // header may be misaligned
    if ((header & 0x7FFF) != FROZEN_COOKIE) {
        return NULL;
    }
    int32_t num_containers = (header >> 15);

    // typecodes, counts and keys
    if (length < 4 + (size_t)num_containers * (1 + 2 + 2)) {
        return NULL;
    }
    uint16_t *keys = (uint16_t *)(buf + length - 4 - num_containers * 5);
    uint16_t *counts = (uint16_t *)(buf + length - 4 - num_containers * 3);
    uint8_t *typecodes = (uint8_t *)(buf + length - 4 - num_containers * 1);

    // {bitset,array,run}_zone
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;
    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                num_bitset_containers++;
                bitset_zone_size += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            case RUN_CONTAINER_TYPE:
                num_run_containers++;
                run_zone_size += counts[i] * sizeof(rle16_t);
                break;
            case ARRAY_CONTAINER_TYPE:
                num_array_containers++;
                array_zone_size += (counts[i] + UINT32_C(1)) * sizeof(uint16_t);
                break;
            default:
                return NULL;
        }
    }
    if (length != bitset_zone_size + run_zone_size + array_zone_size +
                  5 * num_containers + 4) {
        return NULL;
    }
    uint64_t *bitset_zone = (uint64_t*) (buf);
    rle16_t *run_zone = (rle16_t*) (buf + bitset_zone_size);
    uint16_t *array_zone = (uint16_t*) (buf + bitset_zone_size + run_zone_size);

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t*);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);

    char *arena = (char *)malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb = (roaring_bitmap_t *)
            arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.keys = (uint16_t *)keys;
    rb->high_low_container.typecodes = (uint8_t *)typecodes;
    rb->high_low_container.containers =
        (container_t **)arena_alloc(&arena,
                                    sizeof(container_t*) * num_containers);
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_container_t *bitset = (bitset_container_t *)
                        arena_alloc(&arena, sizeof(bitset_container_t));
                bitset->words = bitset_zone;
                bitset->cardinality = counts[i] + UINT32_C(1);
                rb->high_low_container.containers[i] = bitset;
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                break;
            }
            case RUN_CONTAINER_TYPE: {
                run_container_t *run = (run_container_t *)
                        arena_alloc(&arena, sizeof(run_container_t));
                run->capacity = counts[i];
                run->n_runs = counts[i];
                run->runs = run_zone;
                rb->high_low_container.containers[i] = run;
                run_zone += run->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                array_container_t *array = (array_container_t *)
                        arena_alloc(&arena, sizeof(array_container_t));
                array->capacity = counts[i] + UINT32_C(1);
                array->cardinality = counts[i] + UINT32_C(1);
                array->array = array_zone;
                rb->high_low_container.containers[i] = array;
                array_zone += counts[i] + UINT32_C(1);
                break;
            }
            default:
                free(arena);
                return NULL;
        }
    }

    return rb;
}